

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O1

void __thiscall OpenMD::LangevinPiston::moveB(LangevinPiston *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  pointer pVVar4;
  pointer pVVar5;
  Snapshot *pSVar6;
  RealType RVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Thermo *this_00;
  uint i_2;
  uint uVar10;
  Molecule *pMVar11;
  undefined1 *puVar12;
  uint i_1;
  long lVar13;
  StuntDouble *pSVar14;
  long lVar15;
  long lVar16;
  pointer ppSVar17;
  ulong uVar18;
  int iVar19;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_3;
  MoleculeIterator i;
  Vector3d frc;
  Vector3d Tb;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector3d vel;
  Vector3d sc;
  Vector3d ji;
  Vector3d local_168;
  Vector3d local_148;
  MoleculeIterator local_128;
  Thermo *local_120;
  ulong local_118;
  double local_110;
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  double local_88;
  double dStack_80;
  double local_78;
  double local_68 [4];
  double local_48;
  double dStack_40;
  double local_38;
  
  iVar19 = 0;
  local_128._M_node = (_Base_ptr)0x0;
  local_e8[2] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_38 = 0.0;
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_68[2] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_78 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_108[2] = 0.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])();
  pMVar11 = SimInfo::beginMolecule
                      ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                       &local_128);
  if (pMVar11 != (Molecule *)0x0) {
    do {
      ppSVar17 = (pMVar11->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar17 ==
          (pMVar11->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar14 = (StuntDouble *)0x0;
      }
      else {
        pSVar14 = *ppSVar17;
      }
      if (pSVar14 != (StuntDouble *)0x0) {
        pVVar4 = (this->super_NPT).oldVel.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar5 = (this->super_NPT).oldJi.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)iVar19 * 0x18;
        do {
          ppSVar17 = ppSVar17 + 1;
          pSVar6 = pSVar14->snapshotMan_->currentSnapshot_;
          lVar16 = (long)pSVar14->localIndex_;
          lVar13 = *(long *)((long)&(pSVar6->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_);
          puVar1 = (undefined8 *)(lVar13 + lVar16 * 0x18);
          uVar8 = *puVar1;
          uVar9 = puVar1[1];
          *(undefined8 *)((long)(pVVar4->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
               *(undefined8 *)(lVar13 + 0x10 + lVar16 * 0x18);
          puVar1 = (undefined8 *)((long)(pVVar4->super_Vector<double,_3U>).data_ + lVar15);
          *puVar1 = uVar8;
          puVar1[1] = uVar9;
          if (pSVar14->objType_ - otDAtom < 2) {
            lVar13 = *(long *)((long)&(pSVar6->atomData).angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_)
            ;
            puVar1 = (undefined8 *)(lVar13 + lVar16 * 0x18);
            uVar8 = *puVar1;
            uVar9 = puVar1[1];
            *(undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
                 *(undefined8 *)(lVar13 + 0x10 + lVar16 * 0x18);
            puVar1 = (undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar15);
            *puVar1 = uVar8;
            puVar1[1] = uVar9;
          }
          if (ppSVar17 ==
              (pMVar11->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar14 = (StuntDouble *)0x0;
          }
          else {
            pSVar14 = *ppSVar17;
          }
          lVar15 = lVar15 + 0x18;
          iVar19 = iVar19 + 1;
        } while (pSVar14 != (StuntDouble *)0x0);
      }
      pMVar11 = SimInfo::nextMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_128);
    } while (pMVar11 != (Molecule *)0x0);
  }
  local_120 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar7 = Thermo::getVolume(local_120);
  (this->super_NPT).instaVol = RVar7;
  if (0 < (this->super_NPT).maxIterNum_) {
    uVar18 = 0;
    do {
      this_00 = local_120;
      local_118 = uVar18;
      RVar7 = Thermo::getTemperature(local_120);
      (this->super_NPT).instaTemp = RVar7;
      RVar7 = Thermo::getPressure(this_00);
      (this->super_NPT).instaPress = RVar7;
      (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x16])
                (this);
      (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x13])
                (this);
      pMVar11 = SimInfo::beginMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_128);
      if (pMVar11 != (Molecule *)0x0) {
        uVar18 = 0;
        do {
          ppSVar17 = (pMVar11->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppSVar17 ==
              (pMVar11->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar14 = (StuntDouble *)0x0;
          }
          else {
            pSVar14 = *ppSVar17;
          }
          if (pSVar14 != (StuntDouble *)0x0) {
            uVar18 = (ulong)(int)uVar18;
            lVar15 = uVar18 * 0x18;
            do {
              lVar13 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar14->storage_);
              local_108[2] = *(double *)(lVar13 + 0x10 + (long)pSVar14->localIndex_ * 0x18);
              pdVar2 = (double *)(lVar13 + (long)pSVar14->localIndex_ * 0x18);
              local_108[0] = *pdVar2;
              local_108[1] = pdVar2[1];
              local_110 = pSVar14->mass_;
              (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator
                [0x11])(this,local_68,uVar18 & 0xffffffff);
              pVVar4 = (this->super_NPT).oldVel.
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar3 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
              local_a8[0] = 0.0;
              local_a8[1] = 0.0;
              local_a8[2] = 0.0;
              lVar13 = 0;
              do {
                local_a8[lVar13] = local_108[lVar13] * ((dVar3 * 0.0004184) / local_110);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_168.super_Vector<double,_3U>.data_[0] = 0.0;
              local_168.super_Vector<double,_3U>.data_[1] = 0.0;
              local_168.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_168.super_Vector<double,_3U>.data_[lVar13] =
                     *(double *)
                      ((long)(pVVar4->super_Vector<double,_3U>).data_ + lVar13 * 8 + lVar15) +
                     local_a8[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_c8[0] = 0.0;
              local_c8[1] = 0.0;
              local_c8[2] = 0.0;
              lVar13 = 0;
              do {
                local_c8[lVar13] = local_68[lVar13] * dVar3;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_148.super_Vector<double,_3U>.data_[0] = 0.0;
              local_148.super_Vector<double,_3U>.data_[1] = 0.0;
              local_148.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_148.super_Vector<double,_3U>.data_[lVar13] =
                     local_168.super_Vector<double,_3U>.data_[lVar13] - local_c8[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_78 = local_148.super_Vector<double,_3U>.data_[2];
              local_88 = local_148.super_Vector<double,_3U>.data_[0];
              dStack_80 = local_148.super_Vector<double,_3U>.data_[1];
              pSVar6 = pSVar14->snapshotMan_->currentSnapshot_;
              lVar16 = (long)pSVar14->localIndex_;
              lVar13 = *(long *)((long)&(pSVar6->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar14->storage_);
              *(double *)(lVar13 + 0x10 + lVar16 * 0x18) =
                   local_148.super_Vector<double,_3U>.data_[2];
              pdVar2 = (double *)(lVar13 + lVar16 * 0x18);
              *pdVar2 = local_148.super_Vector<double,_3U>.data_[0];
              pdVar2[1] = local_148.super_Vector<double,_3U>.data_[1];
              if (pSVar14->objType_ - otDAtom < 2) {
                puVar12 = (undefined1 *)
                          (lVar16 * 0x18 +
                          *(long *)((long)&(pSVar6->atomData).torque.
                                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                   pSVar14->storage_));
                local_168.super_Vector<double,_3U>.data_[0] = 0.0;
                local_168.super_Vector<double,_3U>.data_[1] = 0.0;
                local_168.super_Vector<double,_3U>.data_[2] = 0.0;
                if ((Vector3d *)puVar12 != &local_168) {
                  lVar13 = 0;
                  do {
                    local_168.super_Vector<double,_3U>.data_[lVar13] =
                         *(double *)(puVar12 + lVar13 * 8);
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                }
                StuntDouble::lab2Body(&local_148,pSVar14,&local_168);
                local_e8[2] = local_148.super_Vector<double,_3U>.data_[2];
                local_e8[0] = local_148.super_Vector<double,_3U>.data_[0];
                local_e8[1] = local_148.super_Vector<double,_3U>.data_[1];
                pVVar4 = (this->super_NPT).oldJi.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar3 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
                local_168.super_Vector<double,_3U>.data_[0] = 0.0;
                local_168.super_Vector<double,_3U>.data_[1] = 0.0;
                local_168.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar13 = 0;
                do {
                  local_168.super_Vector<double,_3U>.data_[lVar13] =
                       local_e8[lVar13] * dVar3 * 0.0004184;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_148.super_Vector<double,_3U>.data_[0] = 0.0;
                local_148.super_Vector<double,_3U>.data_[1] = 0.0;
                local_148.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar13 = 0;
                do {
                  local_148.super_Vector<double,_3U>.data_[lVar13] =
                       *(double *)
                        ((long)(pVVar4->super_Vector<double,_3U>).data_ + lVar13 * 8 + lVar15) +
                       local_168.super_Vector<double,_3U>.data_[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_38 = local_148.super_Vector<double,_3U>.data_[2];
                local_48 = local_148.super_Vector<double,_3U>.data_[0];
                dStack_40 = local_148.super_Vector<double,_3U>.data_[1];
                iVar19 = pSVar14->localIndex_;
                lVar13 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).
                                          angularMomentum.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar14->storage_);
                *(double *)(lVar13 + 0x10 + (long)iVar19 * 0x18) =
                     local_148.super_Vector<double,_3U>.data_[2];
                pdVar2 = (double *)(lVar13 + (long)iVar19 * 0x18);
                *pdVar2 = local_148.super_Vector<double,_3U>.data_[0];
                pdVar2[1] = local_148.super_Vector<double,_3U>.data_[1];
              }
              ppSVar17 = ppSVar17 + 1;
              if (ppSVar17 ==
                  (pMVar11->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pSVar14 = (StuntDouble *)0x0;
              }
              else {
                pSVar14 = *ppSVar17;
              }
              uVar18 = uVar18 + 1;
              lVar15 = lVar15 + 0x18;
            } while (pSVar14 != (StuntDouble *)0x0);
          }
          pMVar11 = SimInfo::nextMolecule
                              ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.
                               info_,&local_128);
        } while (pMVar11 != (Molecule *)0x0);
      }
      Rattle::constraintB((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rattle_)
      ;
      iVar19 = (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator
                 [0x14])(this);
    } while (((char)iVar19 == '\0') &&
            (uVar10 = (int)local_118 + 1, uVar18 = (ulong)uVar10,
            (int)uVar10 < (this->super_NPT).maxIterNum_));
  }
  (*((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void LangevinPiston::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    instaVol = thermo.getVolume();

    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb;

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();
      if (this->etaConverged()) break;
    }

    flucQ_->moveB();
    saveEta();
  }